

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::SpotLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,SpotLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  uintptr_t uVar1;
  int iVar2;
  Float *in_R8;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined8 uVar9;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar11 [64];
  span<const_float> weights;
  SampledSpectrum SVar13;
  Vector3f VVar14;
  Float sectionPDF;
  Float local_140;
  Float local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  Point2f u1_local;
  Float p [2];
  LightLeSample local_e8;
  Ray ray;
  undefined1 extraout_var [60];
  undefined1 auVar10 [56];
  undefined1 auVar12 [56];
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_138 = auVar6._0_16_;
  u1_local.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_138);
  p[0] = 1.0 - this->cosFalloffStart;
  p[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  weights.n = (size_t)&sectionPDF;
  weights.ptr = (float *)0x2;
  local_13c = time;
  iVar2 = SampleDiscrete((pbrt *)p,weights,u2.super_Tuple2<pbrt::Point2,_float>.x,(Float *)0x0,in_R8
                        );
  if (iVar2 == 0) {
    auVar10 = (undefined1  [56])0x0;
    VVar14 = SampleUniformCone(&u1_local,this->cosFalloffStart);
    auVar7._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    auVar4 = auVar7._0_16_;
    local_138._0_4_ = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6 = ZEXT464((uint)((1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * sectionPDF));
  }
  else {
    local_128 = vmovshdup_avx(local_138);
    auVar5._0_4_ = SampleSmoothStep(local_138._0_4_,this->cosFalloffEnd,this->cosFalloffStart);
    auVar5._4_60_ = extraout_var;
    auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar5._0_16_,auVar5._0_16_);
    auVar4 = vmaxss_avx(auVar4,ZEXT816(0) << 0x40);
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    uVar9 = auVar4._8_8_;
    local_140 = auVar5._0_4_;
    VVar14 = SphericalDirection(auVar4._0_4_,auVar5._0_4_,
                                ((float)local_128._0_4_ + (float)local_128._0_4_) * 3.1415927);
    local_138._0_4_ = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
    FVar3 = SmoothStepPDF(local_140,this->cosFalloffEnd,this->cosFalloffStart);
    auVar4._8_8_ = uVar9;
    auVar4._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),(FVar3 * sectionPDF) / 6.2831855));
  }
  uVar1 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_128._0_4_ = auVar6._0_4_;
  local_e8.L.values.values[0] = 0.0;
  local_e8.L.values.values[1] = 0.0;
  local_e8.L.values.values[2] = 0.0;
  uVar9 = vmovlps_avx(auVar4);
  local_e8.L.values.values[3] = (float)uVar9;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)((ulong)uVar9 >> 0x20);
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_138._0_4_;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.z = local_13c;
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar1;
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(uVar1 >> 0x20);
  Transform::operator()(&ray,&(this->super_LightBase).renderFromLight,(Ray *)&local_e8,(Float *)0x0)
  ;
  VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar6._0_8_;
  VVar14.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._0_4_;
  auVar12 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
  auVar10 = auVar6._8_56_;
  SVar13 = I(this,VVar14,lambda);
  auVar11._0_8_ = SVar13.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar8._0_8_ = SVar13.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  auVar4 = vmovlhps_avx(auVar8._0_16_,auVar11._0_16_);
  local_e8.L.values.values._0_8_ = auVar4._0_8_;
  local_e8.L.values.values[2] = auVar4._8_4_;
  local_e8.L.values.values[3] = auVar4._12_4_;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.x = ray.o.super_Tuple3<pbrt::Point3,_float>.x;
  local_e8.ray.o.super_Tuple3<pbrt::Point3,_float>.y = ray.o.super_Tuple3<pbrt::Point3,_float>.y;
  local_e8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8.ray.time = ray.time;
  local_e8.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = ray.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_e8.intr.set = false;
  local_e8.pdfPos = 1.0;
  local_e8.pdfDir = (Float)local_128._0_4_;
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_e8);
  pstd::optional<pbrt::Interaction>::~optional(&local_e8.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> SpotLight::SampleLe(Point2f u1, Point2f u2,
                                                  SampledWavelengths &lambda,
                                                  Float time) const {
    // Choose whether to sample spotlight center cone or falloff region
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);

    Vector3f wl;
    Float pdfDir;
    if (section == 0) {
        // Sample spotlight center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = UniformConePDF(cosFalloffStart) * sectionPDF;

    } else {
        // Sample spotlight falloff region
        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        DCHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * sectionPDF /
                 (2 * Pi);
    }
    // Return sampled spotlight ray
    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}